

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O2

void helper_wrpkru_x86_64(CPUX86State *env,uint32_t ecx,uint64_t val)

{
  int exception_index;
  uintptr_t unaff_retaddr;
  
  if ((*(byte *)((long)env->cr + 0x22) & 0x40) == 0) {
    exception_index = 6;
  }
  else {
    if ((ecx == 0) && (val >> 0x20 == 0)) {
      env->pkru = (uint32_t)val;
      tlb_flush_x86_64((CPUState *)(env[-6].mtrr_var + 4));
      return;
    }
    exception_index = 0xd;
  }
  raise_exception_err_ra_x86_64(env,exception_index,0,unaff_retaddr);
}

Assistant:

void helper_wrpkru(CPUX86State *env, uint32_t ecx, uint64_t val)
{
    CPUState *cs = env_cpu(env);

    if ((env->cr[4] & CR4_PKE_MASK) == 0) {
        raise_exception_err_ra(env, EXCP06_ILLOP, 0, GETPC());
    }
    if (ecx != 0 || (val & 0xFFFFFFFF00000000ull)) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }

    env->pkru = val;
    tlb_flush(cs);
}